

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMChildNode.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMChildNode::getPreviousSibling(DOMChildNode *this,DOMNode *thisNode)

{
  DOMNodeImpl *pDVar1;
  DOMNode *pDVar2;
  
  pDVar1 = castToNodeImpl(thisNode);
  if ((pDVar1->flags & 0x10) == 0) {
    pDVar2 = this->previousSibling;
  }
  else {
    pDVar2 = (DOMNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DOMNode * DOMChildNode::getPreviousSibling(const DOMNode *thisNode) const {
    // if we are the firstChild, previousSibling actually refers to our
    // parent's lastChild, but we hide that
    return castToNodeImpl(thisNode)->isFirstChild() ? 0 : previousSibling;
}